

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O2

void __thiscall xemmai::t_object::f_scan_gray(t_object *this)

{
  if (this->v_color != c_color__GRAY) {
    return;
  }
  if (this->v_cyclic != 0) {
    this->v_color = c_color__BLACK;
    f_loop<&(void_xemmai::t_object::f_step<&xemmai::t_object::f_scan_black_push>())>(this);
    return;
  }
  f_loop<&xemmai::t_object::f_scan_gray_step>(this);
  return;
}

Assistant:

void f_scan_gray()
	{
		if (v_color != c_color__GRAY) return;
		if (v_cyclic > 0) {
			v_color = c_color__BLACK;
			f_loop<&t_object::f_step<&t_object::f_scan_black_push>>();
		} else {
			f_loop<&t_object::f_scan_gray_step>();
		}
	}